

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collector.cpp
# Opt level: O0

void __thiscall
jaegertracing::thrift::CollectorClient::send_submitBatches
          (CollectorClient *this,
          vector<jaegertracing::thrift::Batch,_std::allocator<jaegertracing::thrift::Batch>_>
          *batches)

{
  TProtocol *this_00;
  element_type *peVar1;
  void *__buf;
  undefined1 local_88 [16];
  undefined1 local_78 [24];
  Collector_submitBatches_pargs args;
  allocator local_41;
  string local_40;
  int32_t local_1c;
  vector<jaegertracing::thrift::Batch,_std::allocator<jaegertracing::thrift::Batch>_> *pvStack_18;
  int32_t cseqid;
  vector<jaegertracing::thrift::Batch,_std::allocator<jaegertracing::thrift::Batch>_> *batches_local
  ;
  CollectorClient *this_local;
  
  local_1c = 0;
  this_00 = this->oprot_;
  pvStack_18 = batches;
  batches_local =
       (vector<jaegertracing::thrift::Batch,_std::allocator<jaegertracing::thrift::Batch>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"submitBatches",&local_41);
  apache::thrift::protocol::TProtocol::writeMessageBegin(this_00,&local_40,T_CALL,local_1c);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  Collector_submitBatches_pargs::Collector_submitBatches_pargs
            ((Collector_submitBatches_pargs *)(local_78 + 0x10));
  args._vptr_Collector_submitBatches_pargs = (_func_int **)pvStack_18;
  Collector_submitBatches_pargs::write
            ((Collector_submitBatches_pargs *)(local_78 + 0x10),(int)this->oprot_,__buf,
             (size_t)pvStack_18);
  apache::thrift::protocol::TProtocol::writeMessageEnd(this->oprot_);
  apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_78);
  peVar1 = std::
           __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_78);
  (*peVar1->_vptr_TTransport[10])();
  std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<apache::thrift::transport::TTransport> *)local_78);
  apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_88);
  peVar1 = std::
           __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
  (*peVar1->_vptr_TTransport[0xb])();
  std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<apache::thrift::transport::TTransport> *)local_88);
  Collector_submitBatches_pargs::~Collector_submitBatches_pargs
            ((Collector_submitBatches_pargs *)(local_78 + 0x10));
  return;
}

Assistant:

void CollectorClient::send_submitBatches(const std::vector<Batch> & batches)
{
  int32_t cseqid = 0;
  oprot_->writeMessageBegin("submitBatches", ::apache::thrift::protocol::T_CALL, cseqid);

  Collector_submitBatches_pargs args;
  args.batches = &batches;
  args.write(oprot_);

  oprot_->writeMessageEnd();
  oprot_->getTransport()->writeEnd();
  oprot_->getTransport()->flush();
}